

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_validate.cpp
# Opt level: O1

int __thiscall ktx::CommandValidate::OptionsValidate::init(OptionsValidate *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 uVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int extraout_EAX_05;
  int extraout_EAX_06;
  int extraout_EAX_07;
  int extraout_EAX_08;
  int extraout_EAX_09;
  int extraout_EAX_10;
  int iVar3;
  OptionAdder *pOVar4;
  string local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  element_type *local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_140;
  element_type *local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_130;
  string local_120;
  string local_100;
  OptionAdder local_e0;
  shared_ptr<const_cxxopts::Value> local_b8;
  shared_ptr<const_cxxopts::Value> local_a8;
  string local_90;
  string local_70;
  string local_50;
  
  local_168 = &local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"");
  uVar2 = local_158._M_allocated_capacity._0_4_;
  local_e0.m_group._M_string_length = local_160;
  paVar1 = &local_188.field_2;
  if (local_168 == &local_158) {
    local_188.field_2._8_4_ = local_158._8_4_;
    local_188.field_2._12_4_ = local_158._12_4_;
    local_188._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_188._M_dataplus._M_p = (pointer)local_168;
  }
  local_188.field_2._M_allocated_capacity._4_4_ = local_158._M_allocated_capacity._4_4_;
  local_188.field_2._M_allocated_capacity._0_4_ = local_158._M_allocated_capacity._0_4_;
  local_188._M_string_length = local_160;
  local_160 = 0;
  local_158._M_allocated_capacity._0_4_ = local_158._M_allocated_capacity._0_4_ & 0xffffff00;
  local_e0.m_group._M_dataplus._M_p = (pointer)&local_e0.m_group.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p == paVar1) {
    local_e0.m_group.field_2._M_allocated_capacity =
         CONCAT44(local_158._M_allocated_capacity._4_4_,uVar2);
    local_e0.m_group.field_2._8_4_ = local_188.field_2._8_4_;
    local_e0.m_group.field_2._12_4_ = local_188.field_2._12_4_;
  }
  else {
    local_e0.m_group._M_dataplus._M_p = local_188._M_dataplus._M_p;
    local_e0.m_group.field_2._M_allocated_capacity = local_188.field_2._M_allocated_capacity;
  }
  local_188._M_dataplus._M_p = (pointer)paVar1;
  local_168 = &local_158;
  local_e0.m_options = (Options *)ctx;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"e,warnings-as-errors","");
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,"Treat warnings as errors.","");
  cxxopts::value<bool>();
  local_a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_138;
  local_a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_130;
  local_138 = (element_type *)0x0;
  p_Stack_130 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"");
  pOVar4 = cxxopts::OptionAdder::operator()(&local_e0,&local_188,&local_100,&local_a8,&local_120);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"g,gltf-basisu","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"Check compatibility with KHR_texture_basisu glTF extension.","");
  cxxopts::value<bool>();
  local_b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_148;
  local_b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_140;
  local_148 = (element_type *)0x0;
  p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  pOVar4 = cxxopts::OptionAdder::operator()(pOVar4,&local_50,&local_70,&local_b8,&local_90);
  iVar3 = (int)pOVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    iVar3 = extraout_EAX;
  }
  if (local_b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    iVar3 = extraout_EAX_00;
  }
  if (p_Stack_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_140);
    iVar3 = extraout_EAX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    iVar3 = extraout_EAX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    iVar3 = extraout_EAX_03;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    iVar3 = extraout_EAX_04;
  }
  if (local_a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    iVar3 = extraout_EAX_05;
  }
  if (p_Stack_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_130);
    iVar3 = extraout_EAX_06;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    iVar3 = extraout_EAX_07;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar1) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    iVar3 = extraout_EAX_08;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.m_group._M_dataplus._M_p != &local_e0.m_group.field_2) {
    operator_delete(local_e0.m_group._M_dataplus._M_p,
                    local_e0.m_group.field_2._M_allocated_capacity + 1);
    iVar3 = extraout_EAX_09;
  }
  if (local_168 != &local_158) {
    operator_delete(local_168,
                    CONCAT44(local_158._M_allocated_capacity._4_4_,
                             local_158._M_allocated_capacity._0_4_) + 1);
    iVar3 = extraout_EAX_10;
  }
  return iVar3;
}

Assistant:

void init(cxxopts::Options& opts) {
            opts.add_options()
                ("e,warnings-as-errors", "Treat warnings as errors.")
                ("g,gltf-basisu", "Check compatibility with KHR_texture_basisu glTF extension.");
        }